

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compat.c
# Opt level: O0

void remove_padding(void *buf,size_t buf_length,size_t line_size,size_t padding_size,int pixel_size)

{
  long in_RCX;
  size_t in_RDX;
  ulong in_RSI;
  long in_RDI;
  size_t j;
  size_t i;
  size_t padded_line_size;
  undefined8 local_40;
  undefined8 local_38;
  
  local_38 = in_RDX;
  for (local_40 = in_RDX + in_RCX; local_40 < in_RSI; local_40 = in_RDX + in_RCX + local_40) {
    memmove((void *)(in_RDI + local_38),(void *)(in_RDI + local_40),in_RDX);
    local_38 = in_RDX + local_38;
  }
  return;
}

Assistant:

static void remove_padding(void *buf, size_t buf_length,
                           size_t line_size, size_t padding_size,
                           int pixel_size)
{
    size_t padded_line_size = line_size + padding_size;

    size_t i = line_size;
    for (size_t j = padded_line_size; j < buf_length; j += padded_line_size) {
        memmove((char *)buf + i, (char *)buf + j, line_size);
        i += line_size;
    }
}